

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::UnknownFieldSet::ParseFromZeroCopyStream
          (UnknownFieldSet *this,ZeroCopyInputStream *input)

{
  bool bVar1;
  CodedInputStream *in_RDI;
  CodedInputStream coded_input;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  byte bVar2;
  CodedInputStream local_60;
  
  io::CodedInputStream::CodedInputStream
            (in_RDI,(ZeroCopyInputStream *)
                    CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff78))
                            ));
  bVar1 = ParseFromCodedStream
                    ((UnknownFieldSet *)in_RDI,
                     (CodedInputStream *)
                     CONCAT17(in_stack_ffffffffffffff7f,
                              CONCAT16(in_stack_ffffffffffffff7e,
                                       CONCAT15(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff78)
                                      )));
  bVar2 = false;
  if (bVar1) {
    bVar2 = io::CodedInputStream::ConsumedEntireMessage(&local_60);
  }
  io::CodedInputStream::~CodedInputStream(in_RDI);
  return (bool)(bVar2 & 1);
}

Assistant:

bool UnknownFieldSet::ParseFromZeroCopyStream(io::ZeroCopyInputStream* input) {
  io::CodedInputStream coded_input(input);
  return (ParseFromCodedStream(&coded_input) &&
          coded_input.ConsumedEntireMessage());
}